

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFS.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  ostream *poVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  PlanningUnitMADPDiscreteParameters local_9d1 [7];
  undefined1 local_9ca;
  double local_9c8;
  long local_9c0;
  shared_count local_9b8;
  string filename;
  tms ts_before;
  tms ts_after;
  char s [10];
  Arguments args;
  BruteForceSearchPlanner bfs;
  undefined4 local_6f0;
  long local_3d0;
  long local_3c8;
  double local_3c0;
  ofstream of;
  byte abStack_398 [480];
  stringstream ss;
  ostream local_1a8 [376];
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  pDVar1 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&of,"BFS",(allocator<char> *)&filename);
  directories::MADPGetResultsFilename
            ((string *)&bfs,(MultiAgentDecisionProcessInterface *)&of,
             (Arguments *)(pDVar1 + *(long *)(*(long *)pDVar1 + -0x40)));
  poVar2 = std::operator<<(local_1a8,(string *)&bfs);
  poVar2 = std::operator<<(poVar2,"h");
  std::ostream::operator<<(poVar2,args.horizon);
  std::__cxx11::string::~string((string *)&bfs);
  std::__cxx11::string::~string((string *)&of);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&of,filename._M_dataplus._M_p,_S_out);
  if (((abStack_398[*(long *)(_of + -0x18)] & 5) == 0) || (args.dryrun != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Computing ");
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<(poVar2,(string *)&bfs);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&bfs);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_9d1);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_9d1,0));
    local_9ca = args.sparse != 0;
    BruteForceSearchPlanner::BruteForceSearchPlanner(&bfs,(long)args.horizon,pDVar1,local_9d1);
    poVar2 = std::operator<<((ostream *)&std::cout,"BruteForceSearchPlanner initialized");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar4 = ~(args.nrRestarts >> 0x1f) & args.nrRestarts;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      times((tms *)&ts_before);
      BruteForceSearchPlanner::Plan();
      times((tms *)&ts_after);
      local_9c8 = local_3c0;
      std::operator<<((ostream *)&std::cout,"\nvalue=");
      poVar2 = std::ostream::_M_insert<double>(local_9c8);
      std::endl<char,std::char_traits<char>>(poVar2);
      if (args.dryrun == 0) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&of,args.horizon);
        std::operator<<(poVar2,"\t");
        sprintf(s,"%.6f",local_9c8);
        poVar2 = std::operator<<((ostream *)&of,s);
        std::operator<<(poVar2,"\t");
        poVar2 = std::ostream::_M_insert<long>((long)&of);
        std::operator<<(poVar2,"\t");
        poVar2 = std::ostream::_M_insert<long>((long)&of);
        std::operator<<(poVar2,"\t");
        local_9c0 = local_3d0;
        if (local_3c8 != 0) {
          LOCK();
          *(int *)(local_3c8 + 8) = *(int *)(local_3c8 + 8) + 1;
          UNLOCK();
        }
        JPolComponent_VectorImplementation::GetIndex();
        poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&of);
        std::operator<<(poVar2,"\n");
        boost::detail::shared_count::~shared_count(&local_9b8);
        std::ostream::flush();
      }
    }
    if ((args.dryrun == 0) && (args.outputPolicy == true)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts_before
                     ,&filename,"_PolicyFile");
      if (local_3c8 != 0) {
        LOCK();
        *(int *)(local_3c8 + 8) = *(int *)(local_3c8 + 8) + 1;
        UNLOCK();
      }
      local_9c0 = CONCAT44(local_9c0._4_4_,local_6f0);
      JPolComponent_VectorImplementation::ExportPolicyToFile
                ((string *)(local_3d0 + 0x38),(uint *)&ts_before);
      boost::detail::shared_count::~shared_count((shared_count *)&ts_after.tms_stime);
      std::__cxx11::string::~string((string *)&ts_before);
    }
    BruteForceSearchPlanner::~BruteForceSearchPlanner(&bfs);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_9d1);
    iVar3 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"BFS: could not open ");
    poVar2 = std::operator<<(poVar2,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  std::ofstream::~ofstream(&of);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);
    int restarts = args.nrRestarts;

    try {

    DecPOMDPDiscreteInterface* decpomdp =
        GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream ss;
    ss << directories::MADPGetResultsFilename("BFS",*decpomdp,args)
       << "h" << args.horizon;
    string filename=ss.str();
    ofstream of(filename.c_str());
    if(!of && !args.dryrun)
    {
        cerr << "BFS: could not open " << filename << endl;
        return(1);
    }

    cout << "Computing " << ss.str() << endl;
    
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    BruteForceSearchPlanner bfs(args.horizon, decpomdp, &params);

    cout << "BruteForceSearchPlanner initialized" << endl;


    for(int restartI = 0; restartI < restarts; restartI++)
    {
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        ticks_before = times(&ts_before);

        bfs.Plan();

        ticks_after = times(&ts_after);
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;


        double V = bfs.GetExpectedReward();
        cout << "\nvalue="<< V << endl;
//        bfs.GetJointPolicyPureVector()->Print();

        if(! args.dryrun)
        {
            of << args.horizon<<"\t";
            char s[10];
            sprintf(s, "%.6f", V);
            of << s <<"\t";
            of << ticks <<"\t";
            of << utime <<"\t";
            of << bfs.GetJointPolicyPureVector()->GetIndex() <<"\n";
            of.flush();
        }
    }

    if(!args.dryrun && args.outputPolicy)
    {
        string outputFileName = filename + "_PolicyFile";
        bfs.GetJointPolicyPureVector()->ExportPolicyToFile(outputFileName, bfs.GetHorizon());
    }

    } catch(E& e){ e.Print(); }
}